

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

htmlEntityDesc * htmlParseEntityRef(htmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlParserInputPtr in;
  int iVar1;
  xmlChar *str1;
  long lVar2;
  htmlEntityDesc *phVar3;
  
  if (str != (xmlChar **)0x0) {
    *str = (xmlChar *)0x0;
  }
  if (((ctxt != (htmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
     (*ctxt->input->cur == '&')) {
    xmlNextChar(ctxt);
    str1 = htmlParseName(ctxt);
    if (str1 == (xmlChar *)0x0) {
      htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseEntityRef: no name\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
      return (htmlEntityDesc *)0x0;
    }
    if ((ctxt->progressive == 0) && (in = ctxt->input, (long)in->end - (long)in->cur < 0xfa)) {
      xmlParserInputGrow(in,0xfa);
    }
    if (*ctxt->input->cur == ';') {
      if (str != (xmlChar **)0x0) {
        *str = str1;
      }
      phVar3 = (htmlEntityDesc *)0x0;
      lVar2 = 0;
      do {
        iVar1 = xmlStrEqual(str1,*(xmlChar **)((long)&html40EntitiesTable[0].name + lVar2));
        if (iVar1 != 0) {
          phVar3 = (htmlEntityDesc *)((long)&html40EntitiesTable[0].value + lVar2);
          break;
        }
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0x17b8);
      if (phVar3 != (htmlEntityDesc *)0x0) {
        xmlNextChar(ctxt);
        return phVar3;
      }
    }
    else {
      htmlParseErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,"htmlParseEntityRef: expecting \';\'\n",
                   (xmlChar *)0x0,(xmlChar *)0x0);
      if (str == (xmlChar **)0x0) {
        return (htmlEntityDesc *)0x0;
      }
      *str = str1;
    }
  }
  return (htmlEntityDesc *)0x0;
}

Assistant:

const htmlEntityDesc *
htmlParseEntityRef(htmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *name;
    const htmlEntityDesc * ent = NULL;

    if (str != NULL) *str = NULL;
    if ((ctxt == NULL) || (ctxt->input == NULL)) return(NULL);

    if (CUR == '&') {
        NEXT;
        name = htmlParseName(ctxt);
	if (name == NULL) {
	    htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	                 "htmlParseEntityRef: no name\n", NULL, NULL);
	} else {
	    GROW;
	    if (CUR == ';') {
	        if (str != NULL)
		    *str = name;

		/*
		 * Lookup the entity in the table.
		 */
		ent = htmlEntityLookup(name);
		if (ent != NULL) /* OK that's ugly !!! */
		    NEXT;
	    } else {
		htmlParseErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING,
		             "htmlParseEntityRef: expecting ';'\n",
			     NULL, NULL);
	        if (str != NULL)
		    *str = name;
	    }
	}
    }
    return(ent);
}